

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
setDataSource(UA_Server *server,UA_Session *session,UA_VariableNode *node,UA_DataSource *dataSource)

{
  UA_DataSource *dataSource_local;
  UA_VariableNode *node_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (node->nodeClass == UA_NODECLASS_VARIABLE) {
    if (node->valueSource == UA_VALUESOURCE_DATA) {
      UA_DataValue_deleteMembers(&(node->value).data.value);
    }
    (node->value).dataSource.handle = dataSource->handle;
    (node->value).dataSource.read = dataSource->read;
    (node->value).dataSource.write = dataSource->write;
    node->valueSource = UA_VALUESOURCE_DATASOURCE;
    server_local._4_4_ = 0;
  }
  else {
    server_local._4_4_ = 0x805f0000;
  }
  return server_local._4_4_;
}

Assistant:

static UA_StatusCode
setDataSource(UA_Server *server, UA_Session *session,
              UA_VariableNode* node, UA_DataSource *dataSource) {
    if(node->nodeClass != UA_NODECLASS_VARIABLE)
        return UA_STATUSCODE_BADNODECLASSINVALID;
    if(node->valueSource == UA_VALUESOURCE_DATA)
        UA_DataValue_deleteMembers(&node->value.data.value);
    node->value.dataSource = *dataSource;
    node->valueSource = UA_VALUESOURCE_DATASOURCE;
    return UA_STATUSCODE_GOOD;
}